

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomwalk.cpp
# Opt level: O3

void __thiscall
RandomWalk::RandomWalk
          (RandomWalk *this,double *sigma,double *dt,uint *nthreads,size_t *n,size_t *nsteps,
          uint32_t *seed)

{
  pointer *ppRVar1;
  iterator __position;
  double *pdVar2;
  uint uVar3;
  Rng local_4038;
  
  uVar3 = 0;
  this->data = (double *)0x0;
  this->sigma = *sigma;
  this->dt = *dt;
  this->n = *n;
  this->nsteps = *nsteps;
  this->nthreads = (ulong)*nthreads;
  (this->rnd).super__Vector_base<Rng,_std::allocator<Rng>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->rnd).super__Vector_base<Rng,_std::allocator<Rng>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->rnd).super__Vector_base<Rng,_std::allocator<Rng>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (*nthreads != 0) {
    do {
      Rng::Rng(&local_4038,*seed + uVar3);
      __position._M_current =
           (this->rnd).super__Vector_base<Rng,_std::allocator<Rng>_>._M_impl.super__Vector_impl_data
           ._M_finish;
      if (__position._M_current ==
          (this->rnd).super__Vector_base<Rng,_std::allocator<Rng>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<Rng,_std::allocator<Rng>_>::_M_realloc_insert<Rng>
                  (&this->rnd,__position,&local_4038);
      }
      else {
        memcpy(__position._M_current,&local_4038,0x4008);
        ppRVar1 = &(this->rnd).super__Vector_base<Rng,_std::allocator<Rng>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppRVar1 = *ppRVar1 + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < *nthreads);
  }
  pdVar2 = (double *)operator_new__(-(ulong)(*nsteps * *n >> 0x3d != 0) | *nsteps * *n * 8);
  this->data = pdVar2;
  return;
}

Assistant:

RandomWalk::RandomWalk(const double & sigma, const double & dt,const unsigned int &nthreads, const size_t & n, const size_t & nsteps, const uint32_t &seed) : sigma{sigma},dt{dt}, data{nullptr}, n{n}, nsteps{nsteps}, nthreads{nthreads}
{
    for (unsigned int i=0;i<nthreads;++i) {
        rnd.push_back(Rng(seed+i));
    }
    data=new double[n*nsteps];
}